

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void vertical_scroll_page_inter_command_start_proc
               (Am_Object *command,int mouse_x,int mouse_y,Am_Object *ref_obj,Am_Input_Char param_5)

{
  Am_Object local_38;
  Am_Object local_30;
  Am_Object *local_28;
  Am_Object *ref_obj_local;
  int mouse_y_local;
  int mouse_x_local;
  Am_Object *command_local;
  Am_Input_Char param_4_local;
  
  local_28 = ref_obj;
  ref_obj_local._0_4_ = mouse_y;
  ref_obj_local._4_4_ = mouse_x;
  _mouse_y_local = command;
  command_local._4_4_ = param_5;
  Am_Object::Am_Object(&local_30,command);
  Am_Object::Am_Object(&local_38,ref_obj);
  scroll_page_inter_command_start(&local_30,true,&local_38,ref_obj_local._4_4_,(int)ref_obj_local);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void,
                 vertical_scroll_page_inter_command_start,
                 (Am_Object command, int mouse_x, int mouse_y,
                  Am_Object ref_obj, Am_Input_Char /* ic */))
{
  scroll_page_inter_command_start(command, true, ref_obj, mouse_x, mouse_y);
}